

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O2

void __thiscall p2t::Sweep::FillBasin(Sweep *this,SweepContext *tcx,Node *node)

{
  double *pdVar1;
  double dVar2;
  Node *pNVar3;
  Orientation OVar4;
  Node *node_00;
  Node *pNVar5;
  Node *pNVar6;
  
  pNVar6 = node->next;
  pNVar3 = pNVar6->next;
  OVar4 = Orient2d(node->point,pNVar6->point,pNVar3->point);
  if (OVar4 == CCW) {
    pNVar6 = pNVar3;
  }
  (tcx->basin).left_node = pNVar6;
  pNVar3 = pNVar6;
  do {
    node_00 = pNVar3;
    (tcx->basin).bottom_node = node_00;
    pNVar3 = node_00->next;
    if (pNVar3 == (Node *)0x0) break;
  } while (pNVar3->point->y <= node_00->point->y);
  pNVar3 = node_00;
  if (node_00 != pNVar6) {
    do {
      pNVar5 = pNVar3;
      (tcx->basin).right_node = pNVar5;
      pNVar3 = pNVar5->next;
      if (pNVar3 == (Node *)0x0) break;
      dVar2 = pNVar3->point->y;
      pdVar1 = &pNVar5->point->y;
    } while (*pdVar1 <= dVar2 && dVar2 != *pdVar1);
    if (pNVar5 != node_00) {
      (tcx->basin).width = pNVar5->point->x - pNVar6->point->x;
      dVar2 = pNVar6->point->y;
      pdVar1 = &pNVar5->point->y;
      (tcx->basin).left_highest = *pdVar1 <= dVar2 && dVar2 != *pdVar1;
      FillBasinReq(this,tcx,node_00);
      return;
    }
  }
  return;
}

Assistant:

void Sweep::FillBasin(SweepContext& tcx, Node& node)
{
  if (Orient2d(*node.point, *node.next->point, *node.next->next->point) == CCW) {
    tcx.basin.left_node = node.next->next;
  } else {
    tcx.basin.left_node = node.next;
  }

  // Find the bottom and right node
  tcx.basin.bottom_node = tcx.basin.left_node;
  while (tcx.basin.bottom_node->next
         && tcx.basin.bottom_node->point->y >= tcx.basin.bottom_node->next->point->y) {
    tcx.basin.bottom_node = tcx.basin.bottom_node->next;
  }
  if (tcx.basin.bottom_node == tcx.basin.left_node) {
    // No valid basin
    return;
  }

  tcx.basin.right_node = tcx.basin.bottom_node;
  while (tcx.basin.right_node->next
         && tcx.basin.right_node->point->y < tcx.basin.right_node->next->point->y) {
    tcx.basin.right_node = tcx.basin.right_node->next;
  }
  if (tcx.basin.right_node == tcx.basin.bottom_node) {
    // No valid basins
    return;
  }

  tcx.basin.width = tcx.basin.right_node->point->x - tcx.basin.left_node->point->x;
  tcx.basin.left_highest = tcx.basin.left_node->point->y > tcx.basin.right_node->point->y;

  FillBasinReq(tcx, tcx.basin.bottom_node);
}